

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall Imf_3_2::SampleCountChannel::~SampleCountChannel(SampleCountChannel *this)

{
  void *in_RDI;
  SampleCountChannel *unaff_retaddr;
  
  ~SampleCountChannel(unaff_retaddr);
  operator_delete(in_RDI,0x68);
  return;
}

Assistant:

SampleCountChannel::~SampleCountChannel ()
{
    delete[] _numSamples;
    delete[] _sampleListSizes;
    delete[] _sampleListPositions;
}